

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgcnt(fitsfile *fptr,char *value,char *comm,int *status)

{
  int iVar1;
  int *in_RCX;
  undefined1 *in_RSI;
  char strval [71];
  char card [81];
  int tstatus;
  int in_stack_ffffffffffffff2c;
  fitsfile *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char local_88 [48];
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (*in_RCX < 1) {
    *in_RSI = 0;
    iVar1 = ffgnky(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
    if (iVar1 < 1) {
      iVar1 = strncmp(local_88,"CONTINUE  ",10);
      if (iVar1 == 0) {
        strncpy(local_88,"D2345678=  ",10);
        ffpsvc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8
               ,in_stack_ffffffffffffffb0);
        ffc2s(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      else {
        ffmrky(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,(int *)0x1bdffc);
      }
      local_4 = *in_RCX;
    }
    else {
      local_4 = *in_RCX;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgcnt( fitsfile *fptr,     /* I - FITS file pointer         */
            char *value,        /* O - continued string value    */
            char *comm,         /* O - continued comment string  */
            int  *status)       /* IO - error status             */
/*
  Attempt to read the next keyword, returning the string value
  if it is a continuation of the previous string keyword value.
  This uses the HEASARC convention for continuing long string values
  over multiple keywords.  Each continued string is terminated with a
  backslash character, and the continuation follows on the next keyword
  which must have the name CONTINUE without an equal sign in column 9
  of the card.  If the next card is not a continuation, then the returned
  value string will be null.
*/
{
    int tstatus;
    char card[FLEN_CARD], strval[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    tstatus = 0;
    value[0] = '\0';

    if (ffgnky(fptr, card, &tstatus) > 0)  /*  read next keyword  */
        return(*status);                   /*  hit end of header  */

    if (strncmp(card, "CONTINUE  ", 10) == 0)  /* a continuation card? */
    {
        strncpy(card, "D2345678=  ", 10); /* overwrite a dummy keyword name */
        ffpsvc(card, strval, comm, &tstatus);  /*  get the string value & comment */
        ffc2s(strval, value, &tstatus);    /* remove the surrounding quotes */

        if (tstatus)       /*  return null if error status was returned  */
           value[0] = '\0';
    }
    else
        ffmrky(fptr, -1, status);  /* reset the keyword pointer */

    return(*status);
}